

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

ngram_class_t *
ngram_class_new(ngram_model_t *model,int32 tag_wid,int32 start_wid,glist_t classwords)

{
  int32 iVar1;
  int iVar2;
  ngram_class_t *pnVar3;
  int32 *piVar4;
  int local_38;
  float local_34;
  int i;
  float32 tprob;
  gnode_t *gn;
  ngram_class_t *lmclass;
  glist_t classwords_local;
  int32 start_wid_local;
  int32 tag_wid_local;
  ngram_model_t *model_local;
  
  pnVar3 = (ngram_class_t *)
           __ckd_calloc__(1,0x28,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                          ,0x2ad);
  pnVar3->tag_wid = tag_wid;
  pnVar3->start_wid = start_wid;
  iVar1 = glist_count(classwords);
  pnVar3->n_words = iVar1;
  piVar4 = (int32 *)__ckd_calloc__((long)pnVar3->n_words,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                   ,0x2b2);
  pnVar3->prob1 = piVar4;
  pnVar3->nword_hash = (ngram_hash_s *)0x0;
  pnVar3->n_hash = 0;
  local_34 = 0.0;
  for (_i = classwords; _i != (glist_t)0x0; _i = _i->next) {
    local_34 = (float)(_i->data).fl + local_34;
  }
  if ((1.1 < local_34) || (local_34 < 0.9)) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
            ,0x2ba,"Total class probability is %f, will normalize\n",(double)local_34);
    for (_i = classwords; _i != (glist_t)0x0; _i = _i->next) {
      (_i->data).fl = (_i->data).fl / (double)local_34;
    }
  }
  local_38 = 0;
  for (_i = classwords; _i != (glist_t)0x0; _i = _i->next) {
    iVar2 = logmath_log(model->lmath,(float64)(double)(float)(_i->data).fl);
    pnVar3->prob1[local_38] = iVar2;
    local_38 = local_38 + 1;
  }
  return pnVar3;
}

Assistant:

ngram_class_t *
ngram_class_new(ngram_model_t * model, int32 tag_wid, int32 start_wid,
                glist_t classwords)
{
    ngram_class_t *lmclass;
    gnode_t *gn;
    float32 tprob;
    int i;

    lmclass = ckd_calloc(1, sizeof(*lmclass));
    lmclass->tag_wid = tag_wid;
    /* wid_base is the wid (minus class tag) of the first word in the list. */
    lmclass->start_wid = start_wid;
    lmclass->n_words = glist_count(classwords);
    lmclass->prob1 = ckd_calloc(lmclass->n_words, sizeof(*lmclass->prob1));
    lmclass->nword_hash = NULL;
    lmclass->n_hash = 0;
    tprob = 0.0;
    for (gn = classwords; gn; gn = gnode_next(gn)) {
        tprob += gnode_float32(gn);
    }
    if (tprob > 1.1 || tprob < 0.9) {
        E_INFO("Total class probability is %f, will normalize\n", tprob);
        for (gn = classwords; gn; gn = gnode_next(gn)) {
            gn->data.fl /= tprob;
        }
    }
    for (i = 0, gn = classwords; gn; ++i, gn = gnode_next(gn)) {
        lmclass->prob1[i] = logmath_log(model->lmath, gnode_float32(gn));
    }

    return lmclass;
}